

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RaiseChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *thing;
  AActor *pAVar2;
  AActor *this;
  char *pcVar3;
  AActor *raiser;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_40;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e835c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e834c:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e835c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1207,
                  "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e82c5;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e835c;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e834c;
LAB_003e82c5:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003e82ed:
      raiser = this;
      if (param[1].field_0.i == 0) {
        raiser = (AActor *)0x0;
      }
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_40,0x80);
      while( true ) {
        thing = (AActor *)FThinkerIterator::Next(&local_40,false);
        if (thing == (AActor *)0x0) break;
        pAVar2 = GC::ReadBarrier<AActor>((AActor **)&thing->master);
        if (pAVar2 == this) {
          P_Thing_Raise(thing,raiser);
        }
      }
      return 0;
    }
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003e82ed;
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1208,
                "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self)
		{
			P_Thing_Raise(mo, copy ? self : NULL);
		}
	}
	return 0;
}